

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_iso9660.c
# Opt level: O0

int write_null(archive_write *a,size_t size)

{
  ulong __n;
  ulong uVar1;
  int iVar2;
  uchar *__s;
  uchar *__s_00;
  size_t local_48;
  size_t wsize;
  int r;
  uchar *old;
  uchar *p;
  size_t remaining;
  size_t size_local;
  archive_write *a_local;
  
  __n = *(ulong *)((long)a->format_data + 0x102e0);
  __s = wb_buffptr(a);
  if (__n < size) {
    memset(__s,0,__n);
    a_local._4_4_ = wb_consume(a,__n);
    if (a_local._4_4_ == 0) {
      __s_00 = wb_buffptr(a);
      memset(__s_00,0,(long)__s - (long)__s_00);
      uVar1 = *(ulong *)((long)a->format_data + 0x102e0);
      for (remaining = size - __n; remaining != 0; remaining = remaining - local_48) {
        local_48 = remaining;
        if (uVar1 < remaining) {
          local_48 = uVar1;
        }
        iVar2 = wb_consume(a,local_48);
        if (iVar2 != 0) {
          return iVar2;
        }
      }
      a_local._4_4_ = 0;
    }
  }
  else {
    memset(__s,0,size);
    a_local._4_4_ = wb_consume(a,size);
  }
  return a_local._4_4_;
}

Assistant:

static int
write_null(struct archive_write *a, size_t size)
{
	size_t remaining;
	unsigned char *p, *old;
	int r;

	remaining = wb_remaining(a);
	p = wb_buffptr(a);
	if (size <= remaining) {
		memset(p, 0, size);
		return (wb_consume(a, size));
	}
	memset(p, 0, remaining);
	r = wb_consume(a, remaining);
	if (r != ARCHIVE_OK)
		return (r);
	size -= remaining;
	old = p;
	p = wb_buffptr(a);
	memset(p, 0, old - p);
	remaining = wb_remaining(a);
	while (size) {
		size_t wsize = size;

		if (wsize > remaining)
			wsize = remaining;
		r = wb_consume(a, wsize);
		if (r != ARCHIVE_OK)
			return (r);
		size -= wsize;
	}
	return (ARCHIVE_OK);
}